

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::PopTableBackground(void)

{
  ImVec4 *pIVar1;
  ImGuiTable *pIVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiTableColumn *pIVar8;
  
  pIVar2 = GImGui->CurrentTable;
  pIVar8 = (pIVar2->Columns).Data + pIVar2->CurrentColumn;
  if (pIVar8 < (pIVar2->Columns).DataEnd) {
    pIVar3 = GImGui->CurrentWindow;
    IVar5 = (pIVar2->HostBackupClipRect).Min;
    IVar6 = (pIVar2->HostBackupClipRect).Max;
    IVar7 = (pIVar2->HostBackupClipRect).Max;
    (pIVar3->ClipRect).Min = (pIVar2->HostBackupClipRect).Min;
    (pIVar3->ClipRect).Max = IVar7;
    pIVar4 = pIVar3->DrawList;
    (pIVar4->_CmdHeader).ClipRect.x = IVar5.x;
    (pIVar4->_CmdHeader).ClipRect.y = IVar5.y;
    (pIVar4->_CmdHeader).ClipRect.z = IVar6.x;
    (pIVar4->_CmdHeader).ClipRect.w = IVar6.y;
    pIVar1 = (pIVar3->DrawList->_ClipRectStack).Data +
             (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar5.x;
    pIVar1->y = IVar5.y;
    pIVar1->z = IVar6.x;
    pIVar1->w = IVar6.y;
    ImDrawListSplitter::SetCurrentChannel
              (&pIVar2->DrawSplitter,pIVar3->DrawList,(int)pIVar8->DrawChannelCurrent);
    return;
  }
  __assert_fail("p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_internal.h"
                ,0x20a,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

void    ImGui::PopTableBackground()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}